

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O0

void Ptex::v2_4::(anonymous_namespace)::Apply<unsigned_short,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  int iVar1;
  int iVar2;
  int iVar3;
  VecMult<unsigned_short,_1> *pVVar4;
  VecMult<unsigned_short,_1> *this;
  float *in_RDX;
  Res *in_RDI;
  unsigned_short *pRowEnd;
  float *kup;
  unsigned_short *pEnd;
  unsigned_short *p;
  float *kvp;
  int rowskip;
  int datalen;
  int rowlen;
  float *rowResult;
  float weight;
  float *in_stack_ffffffffffffff98;
  VecMult<unsigned_short,_1> *local_48;
  
  iVar2 = Res::u(in_RDI);
  iVar1 = *(int *)(in_RDI + 6);
  weight = *(float *)(in_RDI + 4);
  iVar3 = Res::u(in_RDI);
  local_48 = (VecMult<unsigned_short,_1> *)
             ((long)in_RDX + (long)((int)weight * iVar3 + *(int *)(in_RDI + 2)) * 2);
  pVVar4 = local_48 + (long)(*(int *)(in_RDI + 8) * iVar2) * 2;
  for (; local_48 != pVVar4; local_48 = local_48 + (long)(iVar2 - iVar1) * 2) {
    this = local_48 + (long)iVar1 * 2;
    PtexUtils::VecMult<unsigned_short,_1>::VecMult
              ((VecMult<unsigned_short,_1> *)&stack0xffffffffffffff9f);
    PtexUtils::VecMult<unsigned_short,_1>::operator()
              (this,in_stack_ffffffffffffff98,(unsigned_short *)in_RDX,weight);
    while (local_48 = local_48 + 2, local_48 != this) {
      PtexUtils::VecAccum<unsigned_short,_1>::VecAccum
                ((VecAccum<unsigned_short,_1> *)&stack0xffffffffffffff9e);
      PtexUtils::VecAccum<unsigned_short,_1>::operator()
                ((VecAccum<unsigned_short,_1> *)this,in_stack_ffffffffffffff98,
                 (unsigned_short *)in_RDX,weight);
    }
    PtexUtils::VecAccum<float,_1>::VecAccum((VecAccum<float,_1> *)&stack0xffffffffffffff9d);
    PtexUtils::VecAccum<float,_1>::operator()
              ((VecAccum<float,_1> *)this,in_stack_ffffffffffffff98,in_RDX,weight);
  }
  return;
}

Assistant:

void Apply(PtexSeparableKernel& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nChan;
        int datalen = k.uw * nChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMult<T,nChan>()(rowResult, p, *kup++);
            p += nChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccum<T,nChan>()(rowResult, p, *kup++);
                p += nChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccum<float,nChan>()(result, rowResult, *kvp++);
            p += rowskip;
        }
    }